

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ShaderAtomicAndCase::getInputs
          (ShaderAtomicAndCase *this,int numValues,int stride,void *inputs)

{
  Precision PVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  Random rnd;
  
  dVar2 = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2);
  PVar1 = (this->super_ShaderAtomicOpCase).m_precision;
  iVar6 = 0x20;
  if (PVar1 != PRECISION_HIGHP) {
    iVar6 = (uint)(PVar1 == PRECISION_MEDIUMP) * 8 + 8;
  }
  uVar10 = ~(-1 << ((byte)iVar6 & 0x1f));
  if (PVar1 == PRECISION_HIGHP) {
    uVar10 = 0xffffffff;
  }
  uVar8 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  iVar11 = 0;
  uVar7 = 0;
  if (0 < (int)uVar8) {
    uVar7 = (ulong)uVar8;
  }
  iVar3 = numValues / (int)uVar8;
  if (numValues / (int)uVar8 < 1) {
    iVar3 = iVar11;
  }
  for (iVar4 = 0; iVar4 != iVar3; iVar4 = iVar4 + 1) {
    iVar5 = de::Random::getInt(&rnd,0,iVar6 + -2);
    uVar12 = uVar7;
    iVar9 = iVar11;
    while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
      dVar2 = deRandom_getUint32(&rnd.m_rnd);
      *(deUint32 *)((long)inputs + (long)iVar9) = dVar2 & uVar10 | 1 << ((byte)iVar5 & 0x1f);
      iVar9 = iVar9 + stride;
    }
    iVar11 = iVar11 + uVar8 * stride;
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	valueMask		= numBits == 32 ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupMask		= 1<<rnd.getInt(0, numBits-2); // One bit is always set.

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = (rnd.getUint32() & valueMask) | groupMask;
		}
	}